

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void ssh_ppl_replace(PacketProtocolLayer *old,PacketProtocolLayer *new)

{
  PacketProtocolLayer **ppPVar1;
  
  new->bpp = old->bpp;
  ssh_ppl_setup_queues(new,old->in_pq,old->out_pq);
  ppPVar1 = old->selfptr;
  new->selfptr = ppPVar1;
  new->seat = old->seat;
  new->ssh = old->ssh;
  *ppPVar1 = new;
  ssh_ppl_free(old);
  queue_idempotent_callback(&new->ic_process_queue);
  return;
}

Assistant:

void ssh_ppl_replace(PacketProtocolLayer *old, PacketProtocolLayer *new)
{
    new->bpp = old->bpp;
    ssh_ppl_setup_queues(new, old->in_pq, old->out_pq);
    new->selfptr = old->selfptr;
    new->seat = old->seat;
    new->ssh = old->ssh;

    *new->selfptr = new;
    ssh_ppl_free(old);

    /* The new layer might need to be the first one that sends a
     * packet, so trigger a call to its main coroutine immediately. If
     * it doesn't need to go first, the worst that will do is return
     * straight away. */
    queue_idempotent_callback(&new->ic_process_queue);
}